

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void>
kj::anon_unknown_0::writeEach(AsyncOutputStream *out,ArrayPtr<const_kj::StringPtr> parts)

{
  PromiseNode *pPVar1;
  int iVar2;
  TransformPromiseNodeBase *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PromiseNode *in_RCX;
  Disposer *pDVar3;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  StringPtr *pSVar4;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar5;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pDVar3 = (Disposer *)parts.size_;
  pSVar4 = parts.ptr;
  if (in_RCX == (PromiseNode *)0x0) {
    OVar5 = heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
    out->_vptr_AsyncOutputStream = (_func_int **)CONCAT44(uStack_34,local_38);
    out[1]._vptr_AsyncOutputStream = (_func_int **)CONCAT44(uStack_2c,uStack_30);
  }
  else {
    (**(code **)(pSVar4->content).ptr)
              (&local_58,pSVar4,pDVar3->_vptr_Disposer,(long)pDVar3[1]._vptr_Disposer + -1);
    this = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_58,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:406:13),_kj::_::PropagateException>
               ::anon_class_24_2_d933cefb_for_func::operator());
    (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0043d7a0;
    this[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pSVar4;
    this[1].dependency.disposer = pDVar3;
    this[1].dependency.ptr = in_RCX;
    local_48.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::writeEach(kj::AsyncOutputStream&,kj::ArrayPtr<kj::StringPtr_const>)::$_0,kj::_::PropagateException>>
          ::instance;
    local_48.ptr = (PromiseNode *)this;
    OVar5 = (Own<kj::_::ImmediatePromiseNode<kj::_::Void>_>)
            heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_48);
    pPVar1 = local_48.ptr;
    *(undefined4 *)&out->_vptr_AsyncOutputStream = local_38;
    *(undefined4 *)((long)&out->_vptr_AsyncOutputStream + 4) = uStack_34;
    *(undefined4 *)&out[1]._vptr_AsyncOutputStream = uStack_30;
    *(undefined4 *)((long)&out[1]._vptr_AsyncOutputStream + 4) = uStack_2c;
    if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      iVar2 = (**(local_48.disposer)->_vptr_Disposer)
                        (local_48.disposer,
                         ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                         (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
      OVar5.disposer._4_4_ = extraout_var;
      OVar5.disposer._0_4_ = iVar2;
      OVar5.ptr = extraout_RDX;
    }
    pPVar1 = local_58.ptr;
    if (local_58.ptr != (PromiseNode *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      iVar2 = (**(local_58.disposer)->_vptr_Disposer)
                        (local_58.disposer,
                         pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
      OVar5.disposer._4_4_ = extraout_var_00;
      OVar5.disposer._0_4_ = iVar2;
      OVar5.ptr = extraout_RDX_00;
    }
  }
  return (PromiseBase)(PromiseBase)OVar5;
}

Assistant:

kj::Promise<void> writeEach(kj::AsyncOutputStream& out, kj::ArrayPtr<const kj::StringPtr> parts) {
  if (parts.size() == 0) return kj::READY_NOW;

  return out.write(parts[0].begin(), parts[0].size())
      .then([&out,parts]() {
    return writeEach(out, parts.slice(1, parts.size()));
  });
}